

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void MOJOSHADER_runPreshader(MOJOSHADER_preshader *preshader,float *outregs)

{
  uint *puVar1;
  void *pvVar2;
  size_t __n;
  undefined1 auVar3 [8];
  uint uVar4;
  float *pfVar5;
  double *pdVar6;
  double (*padVar7) [4];
  ulong uVar8;
  double dVar9;
  MOJOSHADER_preshaderOpcode MVar10;
  double dVar11;
  float fVar12;
  undefined1 *__s;
  MOJOSHADER_preshaderInstruction *pMVar13;
  undefined1 *puVar14;
  uint uVar15;
  ulong uVar16;
  MOJOSHADER_preshaderOperand *pMVar17;
  bool bVar18;
  bool bVar19;
  double dVar20;
  long lVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  undefined8 uStack_110;
  undefined1 local_108 [16];
  ulong local_f8;
  uint local_ec;
  MOJOSHADER_preshaderInstruction *local_e8;
  double local_e0;
  undefined1 auStack_d8 [8];
  double src [3] [4];
  int *regsi;
  undefined1 auStack_58 [8];
  double dst [4];
  
  __s = local_108;
  pfVar5 = preshader->registers;
  uVar8 = (ulong)preshader->temp_count;
  if (uVar8 == 0) {
    src[2][3] = 0.0;
  }
  else {
    lVar22 = -(uVar8 * 8 + 0xf & 0xfffffffffffffff0);
    __s = local_108 + lVar22;
    src[2][3] = (double)__s;
    *(undefined8 *)((long)&uStack_110 + lVar22) = 0x129e5c;
    memset(__s,0,uVar8 << 3);
  }
  dst[1] = 0.0;
  dst[2] = 0.0;
  _auStack_58 = (undefined1  [16])0x0;
  src[2][1] = 0.0;
  src[2][2] = 0.0;
  src[1][3] = 0.0;
  src[2][0] = 0.0;
  src[1][1] = 0.0;
  src[1][2] = 0.0;
  src[0][3] = 0.0;
  src[1][0] = 0.0;
  src[0][1] = 0.0;
  src[0][2] = 0.0;
  _auStack_d8 = (undefined1  [16])0x0;
  if (preshader->instruction_count != 0) {
    pMVar13 = preshader->instructions;
    uVar8 = 0;
    auVar23 = _DAT_00139fe0;
    do {
      uVar15 = pMVar13->element_count;
      dVar11 = (double)(ulong)uVar15;
      if ((int)uVar15 < 0) {
        *(undefined8 *)(__s + -8) = 0x12aa56;
        __assert_fail("elems >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x31,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      if (4 < uVar15) {
        *(undefined8 *)(__s + -8) = 0x12aa37;
        __assert_fail("elems <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x32,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      MVar10 = pMVar13->opcode;
      local_ec = uVar15 * 8;
      pMVar17 = pMVar13->operands;
      dst[3] = dVar11;
      local_e8 = pMVar13;
      if (pMVar13->operand_count != 1) {
        local_e0 = (double)(ulong)local_ec;
        lVar22 = (long)dVar11 - 1;
        auVar26._8_4_ = (int)lVar22;
        auVar26._0_8_ = lVar22;
        auVar26._12_4_ = (int)((ulong)lVar22 >> 0x20);
        auVar26 = auVar26 ^ auVar23;
        puVar14 = auStack_d8;
        uVar16 = 0;
        local_108 = auVar26;
        local_f8 = uVar8;
        do {
          dVar11 = dst[3];
          dVar9 = local_e0;
          bVar18 = MVar10 < MOJOSHADER_PRESHADEROP_MIN_SCALAR;
          bVar19 = uVar16 != 0;
          if (MOJOSHADER_PRESHADEROPERAND_TEMP < pMVar17->type) {
            *(undefined8 *)(__s + -8) = 0x12a9f9;
            __assert_fail("0 && \"unexpected preshader operand type.\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                          ,0x77,
                          "void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
          }
          uVar4 = pMVar17->index;
          uVar8 = (ulong)uVar4;
          switch(pMVar17->type) {
          case MOJOSHADER_PRESHADEROPERAND_INPUT:
            if ((ulong)pMVar17->array_register_count == 0) {
              if (bVar18 || bVar19) {
                if (dst[3] != 0.0) {
                  dVar9 = 0.0;
                  do {
                    *(double *)(puVar14 + (long)dVar9 * 8) = (double)pfVar5[uVar4 + SUB84(dVar9,0)];
                    dVar9 = (double)((long)dVar9 + 1);
                  } while (dVar11 != dVar9);
                }
              }
              else {
                auStack_d8 = (undefined1  [8])(double)pfVar5[uVar8];
              }
            }
            else {
              fVar12 = *(float *)((long)pfVar5 + (ulong)(uVar4 & 0xfffffffc));
              uVar8 = 0;
              do {
                puVar1 = pMVar17->array_registers + uVar8;
                uVar8 = uVar8 + 1;
                fVar12 = pfVar5[(int)fVar12 + *puVar1];
              } while (pMVar17->array_register_count != uVar8);
              src[uVar16 - 1][3] = (double)(int)fVar12;
              dVar11 = dst[3];
            }
            break;
          case MOJOSHADER_PRESHADEROPERAND_OUTPUT:
            if (bVar18 || bVar19) {
              if (dst[3] != 0.0) {
                dVar9 = 0.0;
                do {
                  *(double *)(puVar14 + (long)dVar9 * 8) = (double)outregs[uVar4 + SUB84(dVar9,0)];
                  dVar9 = (double)((long)dVar9 + 1);
                } while (dVar11 != dVar9);
              }
            }
            else {
              auStack_d8 = (undefined1  [8])(double)outregs[uVar8];
LAB_0012a096:
            }
            break;
          case MOJOSHADER_PRESHADEROPERAND_LITERAL:
            if (bVar18 || bVar19) {
              if (preshader->literal_count < uVar4 + SUB84(dst[3],0)) {
                *(undefined8 *)(__s + -8) = 0x12aa18;
                __assert_fail("(index + elems) <= preshader->literal_count",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                              ,0x40,
                              "void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)")
                ;
              }
              pdVar6 = preshader->literals;
              *(undefined8 *)(__s + -8) = 0x12a0d5;
              memcpy(src[uVar16 - 1] + 3,pdVar6 + uVar8,(size_t)dVar9);
              dVar11 = dst[3];
              pMVar13 = local_e8;
              auVar23 = _DAT_00139fe0;
              auVar26 = local_108;
            }
            else if (dst[3] != 0.0) {
              dVar9 = preshader->literals[uVar8];
              uVar8 = 0;
              auVar25 = _DAT_0013ba90;
              do {
                bVar18 = auVar26._0_4_ < SUB164(auVar25 ^ auVar23,0);
                iVar24 = SUB164(auVar25 ^ auVar23,4);
                iVar27 = auVar26._4_4_;
                if ((bool)(~(iVar27 < iVar24 || iVar24 == iVar27 && bVar18) & 1)) {
                  *(double *)(auStack_d8 + uVar8) = dVar9;
                }
                if (iVar27 >= iVar24 && (iVar24 != iVar27 || !bVar18)) {
                  *(double *)((long)src[0] + uVar8) = dVar9;
                }
                lVar22 = auVar25._8_8_;
                auVar25._0_8_ = auVar25._0_8_ + 2;
                auVar25._8_8_ = lVar22 + 2;
                uVar8 = uVar8 + 0x10;
              } while ((uVar15 * 8 + 8 & 0x70) != uVar8);
            }
            break;
          case MOJOSHADER_PRESHADEROPERAND_TEMP:
            if (src[2][3] != 0.0) {
              if (!bVar18 && !bVar19) {
                auStack_d8 = *(undefined1 (*) [8])((long)src[2][3] + uVar8 * 8);
                goto LAB_0012a096;
              }
              pvVar2 = (void *)((long)src[2][3] + uVar8 * 8);
              *(undefined8 *)(__s + -8) = 0x12a183;
              memcpy(src[uVar16 - 1] + 3,pvVar2,(size_t)dVar9);
              dVar11 = dst[3];
              pMVar13 = local_e8;
              auVar23 = _DAT_00139fe0;
              auVar26 = local_108;
            }
          }
          uVar16 = uVar16 + 1;
          pMVar17 = pMVar17 + 1;
          puVar14 = puVar14 + 0x20;
        } while (uVar16 < pMVar13->operand_count - 1);
        MVar10 = pMVar13->opcode;
        uVar8 = local_f8;
      }
      switch(MVar10) {
      case MOJOSHADER_PRESHADEROP_MOV:
        if (dVar11 != 0.0) {
          __n = (long)dst[3] * 8;
          *(undefined8 *)(__s + -8) = 0x12a24d;
          memcpy(auStack_58,auStack_d8,__n);
          dVar11 = dst[3];
        }
        break;
      case MOJOSHADER_PRESHADEROP_NEG:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 (double)(*(ulong *)(auStack_d8 + (long)dVar9 * 8) ^ (ulong)DAT_0013bab0);
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_RCP:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] = 1.0 / *(double *)(auStack_d8 + (long)dVar9 * 8);
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_FRC:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            local_e0 = dVar11;
            *(undefined8 *)(__s + -8) = 0x12a706;
            dVar20 = floor(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = local_e0 - dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_EXP:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            *(undefined8 *)(__s + -8) = 0x12a5a0;
            dVar20 = exp(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_LOG:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            *(undefined8 *)(__s + -8) = 0x12a66f;
            dVar20 = log(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_RSQ:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar20 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            if (dVar20 < 0.0) {
              *(undefined8 *)(__s + -8) = 0x12a7bd;
              dVar20 = sqrt(dVar20);
              dVar11 = dst[3];
            }
            else {
              dVar20 = SQRT(dVar20);
            }
            dst[(long)dVar9 - 1] = 1.0 / dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_SIN:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            *(undefined8 *)(__s + -8) = 0x12a6ce;
            dVar20 = sin(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_COS:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            *(undefined8 *)(__s + -8) = 0x12a3d6;
            dVar20 = cos(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ASIN:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            *(undefined8 *)(__s + -8) = 0x12a316;
            dVar20 = asin(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ACOS:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            *(undefined8 *)(__s + -8) = 0x12a3a6;
            dVar20 = acos(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ATAN:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            *(undefined8 *)(__s + -8) = 0x12a2a2;
            dVar20 = atan(dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MIN:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar20 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            if (src[0][(long)dVar9 + 3] <= *(double *)(auStack_d8 + (long)dVar9 * 8)) {
              dVar20 = src[0][(long)dVar9 + 3];
            }
            dst[(long)dVar9 - 1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MAX:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar20 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            if (*(double *)(auStack_d8 + (long)dVar9 * 8) <= src[0][(long)dVar9 + 3]) {
              dVar20 = src[0][(long)dVar9 + 3];
            }
            dst[(long)dVar9 - 1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_LT:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 (double)(-(ulong)(*(double *)(auStack_d8 + (long)dVar9 * 8) <
                                  src[0][(long)dVar9 + 3]) & 0x3ff0000000000000);
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_GE:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 (double)(-(ulong)(src[0][(long)dVar9 + 3] <=
                                  *(double *)(auStack_d8 + (long)dVar9 * 8)) & 0x3ff0000000000000);
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ADD:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 *(double *)(auStack_d8 + (long)dVar9 * 8) + src[0][(long)dVar9 + 3];
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MUL:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 *(double *)(auStack_d8 + (long)dVar9 * 8) * src[0][(long)dVar9 + 3];
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ATAN2:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dVar11 = *(double *)(auStack_d8 + (long)dVar9 * 8);
            dVar20 = src[0][(long)dVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x12a802;
            dVar20 = atan2(dVar11,dVar20);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_DIV:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 *(double *)(auStack_d8 + (long)dVar9 * 8) / src[0][(long)dVar9 + 3];
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_CMP:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            padVar7 = src + 1;
            if (0.0 <= *(double *)(auStack_d8 + (long)dVar9 * 8)) {
              padVar7 = src;
            }
            dst[(long)dVar9 - 1] = (*padVar7)[(long)dVar9 + 3];
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      default:
        *(code **)(__s + -8) = MOJOSHADER_parseEffect;
        __assert_fail("0 && \"Unhandled preshader opcode!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0xb4,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      case MOJOSHADER_PRESHADEROP_DOT:
        if (dVar11 != 0.0) {
          dVar20 = 0.0;
          dVar9 = 0.0;
          do {
            dVar20 = dVar20 + *(double *)(auStack_d8 + (long)dVar9 * 8) * src[0][(long)dVar9 + 3];
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
          if (dVar11 != 0.0) {
            iVar24 = SUB84(dVar11,0);
            lVar22 = (long)dVar11 - 1;
            auVar21._8_4_ = (int)lVar22;
            auVar21._0_8_ = lVar22;
            auVar21._12_4_ = (int)((ulong)lVar22 >> 0x20);
            uVar16 = 0;
            auVar23 = _DAT_0013ba90;
            do {
              auVar26 = auVar21 ^ _DAT_00139fe0;
              auVar25 = auVar23 ^ _DAT_00139fe0;
              if ((bool)(~(auVar25._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar25._0_4_ ||
                          auVar26._4_4_ < auVar25._4_4_) & 1)) {
                dst[uVar16 - 1] = dVar20;
              }
              if ((auVar25._12_4_ != auVar26._12_4_ || auVar25._8_4_ <= auVar26._8_4_) &&
                  auVar25._12_4_ <= auVar26._12_4_) {
                dst[uVar16] = dVar20;
              }
              uVar16 = uVar16 + 2;
              lVar22 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 2;
              auVar23._8_8_ = lVar22 + 2;
              dVar11 = dst[3];
            } while ((iVar24 + 1U & 0xe) != uVar16);
          }
        }
        break;
      case MOJOSHADER_PRESHADEROP_MIN_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            auVar3 = auStack_d8;
            if (src[0][(long)dVar9 + 3] <= (double)auStack_d8) {
              auVar3 = (undefined1  [8])src[0][(long)dVar9 + 3];
            }
            dst[(long)dVar9 - 1] = (double)auVar3;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MAX_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            auVar3 = auStack_d8;
            if ((double)auStack_d8 <= src[0][(long)dVar9 + 3]) {
              auVar3 = (undefined1  [8])src[0][(long)dVar9 + 3];
            }
            dst[(long)dVar9 - 1] = (double)auVar3;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_LT_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 (double)(-(ulong)((double)auStack_d8 < src[0][(long)dVar9 + 3]) &
                         0x3ff0000000000000);
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_GE_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] =
                 (double)(-(ulong)(src[0][(long)dVar9 + 3] <= (double)auStack_d8) &
                         0x3ff0000000000000);
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ADD_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] = src[0][(long)dVar9 + 3] + (double)auStack_d8;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MUL_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] = src[0][(long)dVar9 + 3] * (double)auStack_d8;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ATAN2_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            auVar3 = auStack_d8;
            dVar11 = src[0][(long)dVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x12a74a;
            dVar20 = atan2((double)auVar3,dVar11);
            dVar11 = dst[3];
            dst[(long)dVar9 + -1] = dVar20;
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_DIV_SCALAR:
        if (dVar11 != 0.0) {
          dVar9 = 0.0;
          do {
            dst[(long)dVar9 - 1] = (double)auStack_d8 / src[0][(long)dVar9 + 3];
            dVar9 = (double)((long)dVar9 + 1);
          } while (dVar11 != dVar9);
        }
      }
      auVar23 = _DAT_00139fe0;
      if (pMVar17->type == MOJOSHADER_PRESHADEROPERAND_TEMP) {
        if ((ulong)preshader->temp_count < (ulong)(local_ec >> 3) + (ulong)pMVar17->index) {
          *(undefined8 *)(__s + -8) = 0x12aa75;
          __assert_fail("preshader->temp_count >= operand->index + (elemsbytes / sizeof (double))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0xbc,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)")
          ;
        }
        uVar16 = (ulong)local_ec;
        pvVar2 = (void *)((long)src[2][3] + (ulong)pMVar17->index * 8);
        *(undefined8 *)(__s + -8) = 0x12a98c;
        memcpy(pvVar2,auStack_58,uVar16);
        auVar23 = _DAT_00139fe0;
      }
      else {
        if (pMVar17->type != MOJOSHADER_PRESHADEROPERAND_OUTPUT) {
          *(undefined8 *)(__s + -8) = 0x12aa94;
          __assert_fail("operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0xc1,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)")
          ;
        }
        if (dVar11 != 0.0) {
          uVar15 = pMVar17->index;
          dVar11 = 0.0;
          do {
            outregs[uVar15 + SUB84(dVar11,0)] = (float)dst[(long)dVar11 + -1];
            dVar11 = (double)((long)dVar11 + 1);
          } while (dst[3] != dVar11);
        }
      }
      uVar15 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar15;
      pMVar13 = local_e8 + 1;
    } while (uVar15 < preshader->instruction_count);
  }
  return;
}

Assistant:

void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *preshader,
                             float *outregs)
{
    const float *inregs = preshader->registers;

    // this is fairly straightforward, as there aren't any branching
    //  opcodes in the preshader instruction set (at the moment, at least).
    const int scalarstart = (int) MOJOSHADER_PRESHADEROP_SCALAR_OPS;

    double *temps = NULL;
    if (preshader->temp_count > 0)
    {
        temps = (double *) alloca(sizeof (double) * preshader->temp_count);
        memset(temps, '\0', sizeof (double) * preshader->temp_count);
    } // if

    double dst[4] = { 0, 0, 0, 0 };
    double src[3][4] = { { 0, 0, 0, 0 }, { 0, 0, 0, 0 }, { 0, 0, 0, 0 } };
    const double *src0 = &src[0][0];
    const double *src1 = &src[1][0];
    const double *src2 = &src[2][0];

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    int instit;

    for (instit = 0; instit < preshader->instruction_count; instit++, inst++)
    {
        const MOJOSHADER_preshaderOperand *operand = inst->operands;
        const int elems = inst->element_count;
        const int elemsbytes = sizeof (double) * elems;
        const int isscalarop = (inst->opcode >= scalarstart);

        assert(elems >= 0);
        assert(elems <= 4);

        // load up our operands...
        int opiter, elemiter;
        for (opiter = 0; opiter < inst->operand_count-1; opiter++, operand++)
        {
            const int isscalar = ((isscalarop) && (opiter == 0));
            const unsigned int index = operand->index;
            switch (operand->type)
            {
                case MOJOSHADER_PRESHADEROPERAND_LITERAL:
                {
                    if (!isscalar)
                    {
                        assert((index + elems) <= preshader->literal_count);
                        memcpy(&src[opiter][0], &preshader->literals[index], elemsbytes);
                    } // if
                    else
                    {
                        for (elemiter = 0; elemiter < elems; elemiter++)
                            src[opiter][elemiter] = preshader->literals[index];
                    } // else
                    break;
                } // case

                case MOJOSHADER_PRESHADEROPERAND_INPUT:
                    if (operand->array_register_count > 0)
                    {
                        int i;
                        const int *regsi = (const int *) inregs;
                        int arrIndex = regsi[((index >> 4) * 4) + ((index >> 2) & 3)];
                        for (i = 0; i < operand->array_register_count; i++)
                        {
                            arrIndex = regsi[operand->array_registers[i] + arrIndex];
                        }
                        src[opiter][0] = arrIndex;
                    } // if
                    else if (isscalar)
                        src[opiter][0] = inregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = inregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_OUTPUT:
                    if (isscalar)
                        src[opiter][0] = outregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = outregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_TEMP:
                    if (temps != NULL)
                    {
                        if (isscalar)
                            src[opiter][0] = temps[index];
                        else
                            memcpy(src[opiter], temps + index, elemsbytes);
                    } // if
                    break;

                default:
                    assert(0 && "unexpected preshader operand type.");
                    return;
            } // switch
        } // for

        // run the actual instruction, store result to dst.
        int i;
        switch (inst->opcode)
        {
            #define OPCODE_CASE(op, val) \
                case MOJOSHADER_PRESHADEROP_##op: \
                    for (i = 0; i < elems; i++) { dst[i] = val; } \
                    break;

            //OPCODE_CASE(NOP, 0.0)  // not a real instruction.
            OPCODE_CASE(MOV, src0[i])
            OPCODE_CASE(NEG, -src0[i])
            OPCODE_CASE(RCP, 1.0 / src0[i])
            OPCODE_CASE(FRC, src0[i] - floor(src0[i]))
            OPCODE_CASE(EXP, exp(src0[i]))
            OPCODE_CASE(LOG, log(src0[i]))
            OPCODE_CASE(RSQ, 1.0 / sqrt(src0[i]))
            OPCODE_CASE(SIN, sin(src0[i]))
            OPCODE_CASE(COS, cos(src0[i]))
            OPCODE_CASE(ASIN, asin(src0[i]))
            OPCODE_CASE(ACOS, acos(src0[i]))
            OPCODE_CASE(ATAN, atan(src0[i]))
            OPCODE_CASE(MIN, (src0[i] < src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(MAX, (src0[i] > src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(LT, (src0[i] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE, (src0[i] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD, src0[i] + src1[i])
            OPCODE_CASE(MUL,  src0[i] * src1[i])
            OPCODE_CASE(ATAN2, atan2(src0[i], src1[i]))
            OPCODE_CASE(DIV, src0[i] / src1[i])
            OPCODE_CASE(CMP, (src0[i] >= 0.0) ? src1[i] : src2[i])
            //OPCODE_CASE(NOISE, ???)  // !!! FIXME: don't know what this does
            //OPCODE_CASE(MOVC, ???)  // !!! FIXME: don't know what this does
            OPCODE_CASE(MIN_SCALAR, (src0[0] < src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(MAX_SCALAR, (src0[0] > src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(LT_SCALAR, (src0[0] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE_SCALAR, (src0[0] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD_SCALAR, src0[0] + src1[i])
            OPCODE_CASE(MUL_SCALAR, src0[0] * src1[i])
            OPCODE_CASE(ATAN2_SCALAR, atan2(src0[0], src1[i]))
            OPCODE_CASE(DIV_SCALAR, src0[0] / src1[i])
            //OPCODE_CASE(DOT_SCALAR)  // !!! FIXME: isn't this just a MUL?
            //OPCODE_CASE(NOISE_SCALAR, ???)  // !!! FIXME: ?
            #undef OPCODE_CASE

            case MOJOSHADER_PRESHADEROP_DOT:
            {
                double final = 0.0;
                for (i = 0; i < elems; i++)
                    final += src0[i] * src1[i];
                for (i = 0; i < elems; i++)
                    dst[i] = final;  // !!! FIXME: is this right?
                break;
            } // case

            default:
                assert(0 && "Unhandled preshader opcode!");
                break;
        } // switch

        // Figure out where dst wants to be stored.
        if (operand->type == MOJOSHADER_PRESHADEROPERAND_TEMP)
        {
            assert(preshader->temp_count >=
                    operand->index + (elemsbytes / sizeof (double)));
            memcpy(temps + operand->index, dst, elemsbytes);
        } // if
        else
        {
            assert(operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT);
            for (i = 0; i < elems; i++)
                outregs[operand->index + i] = (float) dst[i];
        } // else
    } // for
}